

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleCloud.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::GoogleCloud::Secrets::rotateRolesetAccountKey
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Secrets *this,Path *path)

{
  Client *client;
  unordered_map<_e0ce3516_> local_e8;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  Url local_40;
  Path *local_20;
  Path *path_local;
  Secrets *this_local;
  
  client = *(Client **)this;
  local_20 = path;
  path_local = (Path *)this;
  this_local = (Secrets *)__return_storage_ptr__;
  Vault::operator+(&local_a0,"roleset/",path);
  std::operator+(&local_80,&local_a0,"/rotate-key");
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_60,&local_80);
  getUrl(&local_40,this,&local_60);
  local_e8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_e8._M_h._M_rehash_policy._4_4_ = 0;
  local_e8._M_h._M_rehash_policy._M_next_resize = 0;
  local_e8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e8._M_h._M_element_count = 0;
  local_e8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_e8._M_h._M_bucket_count = 0;
  local_e8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_map<$e0ce3516$>::unordered_map(&local_e8);
  HttpConsumer::post(__return_storage_ptr__,client,&local_40,&local_e8);
  std::unordered_map<$e0ce3516$>::~unordered_map(&local_e8);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_40);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::GoogleCloud::Secrets::rotateRolesetAccountKey(const Path &path) {
  return HttpConsumer::post(
      client_, getUrl(Path{"roleset/" + path + "/rotate-key"}), Parameters{});
}